

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

QList<QByteArray> * __thiscall
QTimeZonePrivate::availableTimeZoneIds
          (QList<QByteArray> *__return_storage_ptr__,QTimeZonePrivate *this,Territory territory)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QByteArray> QStack_48;
  QList<QByteArrayView> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  matchingTimeZoneIds(&local_30,this,territory);
  (*this->_vptr_QTimeZonePrivate[0x15])(&QStack_48,this);
  selectAvailable(__return_storage_ptr__,&local_30,(QList<QByteArray> *)&QStack_48);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&QStack_48);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArray> QTimeZonePrivate::availableTimeZoneIds(QLocale::Territory territory) const
{
    return selectAvailable(matchingTimeZoneIds(territory), availableTimeZoneIds());
}